

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereAddLimit(WhereClause *pWC,Select *p)

{
  int iCsr_00;
  ExprList *pEVar1;
  Expr *pEVar2;
  Expr *pExpr;
  int ii;
  int iCsr;
  ExprList *pOrderBy;
  Select *p_local;
  WhereClause *pWC_local;
  
  if ((((p->pGroupBy == (ExprList *)0x0) && ((p->selFlags & 9) == 0)) && (p->pSrc->nSrc == 1)) &&
     ((p->pSrc->a[0].pTab)->eTabType == '\x01')) {
    pEVar1 = p->pOrderBy;
    iCsr_00 = p->pSrc->a[0].iCursor;
    for (pExpr._0_4_ = 0; (int)pExpr < pWC->nTerm; pExpr._0_4_ = (int)pExpr + 1) {
      if (((pWC->a[(int)pExpr].wtFlags & 4) == 0) && (pWC->a[(int)pExpr].leftCursor != iCsr_00)) {
        return;
      }
    }
    if (pEVar1 != (ExprList *)0x0) {
      for (pExpr._0_4_ = 0; (int)pExpr < pEVar1->nExpr; pExpr._0_4_ = (int)pExpr + 1) {
        pEVar2 = pEVar1->a[(int)pExpr].pExpr;
        if (pEVar2->op != 0xa7) {
          return;
        }
        if (pEVar2->iTable != iCsr_00) {
          return;
        }
        if ((pEVar1->a[(int)pExpr].fg.sortFlags & 2) != 0) {
          return;
        }
      }
    }
    whereAddLimitExpr(pWC,p->iLimit,p->pLimit->pLeft,iCsr_00,0x49);
    if (0 < p->iOffset) {
      whereAddLimitExpr(pWC,p->iOffset,p->pLimit->pRight,iCsr_00,0x4a);
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3WhereAddLimit(WhereClause *pWC, Select *p){
  assert( p!=0 && p->pLimit!=0 );                 /* 1 -- checked by caller */
  if( p->pGroupBy==0
   && (p->selFlags & (SF_Distinct|SF_Aggregate))==0             /* 2 */
   && (p->pSrc->nSrc==1 && IsVirtual(p->pSrc->a[0].pTab))       /* 3 */
  ){
    ExprList *pOrderBy = p->pOrderBy;
    int iCsr = p->pSrc->a[0].iCursor;
    int ii;

    /* Check condition (4). Return early if it is not met. */
    for(ii=0; ii<pWC->nTerm; ii++){
      if( pWC->a[ii].wtFlags & TERM_CODED ){
        /* This term is a vector operation that has been decomposed into
        ** other, subsequent terms.  It can be ignored. See tag-20220128a */
        assert( pWC->a[ii].wtFlags & TERM_VIRTUAL );
        assert( pWC->a[ii].eOperator==WO_ROWVAL );
        continue;
      }
      if( pWC->a[ii].leftCursor!=iCsr ) return;
    }

    /* Check condition (5). Return early if it is not met. */
    if( pOrderBy ){
      for(ii=0; ii<pOrderBy->nExpr; ii++){
        Expr *pExpr = pOrderBy->a[ii].pExpr;
        if( pExpr->op!=TK_COLUMN ) return;
        if( pExpr->iTable!=iCsr ) return;
        if( pOrderBy->a[ii].fg.sortFlags & KEYINFO_ORDER_BIGNULL ) return;
      }
    }

    /* All conditions are met. Add the terms to the where-clause object. */
    assert( p->pLimit->op==TK_LIMIT );
    whereAddLimitExpr(pWC, p->iLimit, p->pLimit->pLeft,
                      iCsr, SQLITE_INDEX_CONSTRAINT_LIMIT);
    if( p->iOffset>0 ){
      whereAddLimitExpr(pWC, p->iOffset, p->pLimit->pRight,
                        iCsr, SQLITE_INDEX_CONSTRAINT_OFFSET);
    }
  }
}